

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP5Serializer::AddVarArrayField
          (BP5Serializer *this,FMFieldList *FieldP,int *CountP,char *Name,DataType Type,
          int ElementSize,char *SizeField)

{
  BP5Serializer *this_00;
  size_t sVar1;
  size_t sVar2;
  char *__s;
  
  this_00 = (BP5Serializer *)TranslateADIOS2Type2FFS(this,Type);
  sVar1 = strlen((char *)this_00);
  sVar2 = strlen(SizeField);
  sVar1 = sVar1 + sVar2 + 8;
  __s = (char *)malloc(sVar1);
  snprintf(__s,sVar1,"%s[%s]",this_00,SizeField);
  free(this_00);
  AddSimpleField(this_00,FieldP,CountP,Name,__s,8);
  free(__s);
  (*FieldP)[(long)*CountP + -1].field_size = ElementSize;
  return;
}

Assistant:

void BP5Serializer::AddVarArrayField(FMFieldList *FieldP, int *CountP, const char *Name,
                                     const DataType Type, int ElementSize, char *SizeField)
{
    char *TransType = TranslateADIOS2Type2FFS(Type);
    char *TypeWithArray = (char *)malloc(strlen(TransType) + strlen(SizeField) + 8);
    snprintf(TypeWithArray, strlen(TransType) + strlen(SizeField) + 8, "%s[%s]", TransType,
             SizeField);
    free(TransType);
    AddSimpleField(FieldP, CountP, Name, TypeWithArray, sizeof(void *));
    free(TypeWithArray);
    (*FieldP)[*CountP - 1].field_size = ElementSize;
}